

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

void __thiscall chaiscript::ChaiScript_Basic::~ChaiScript_Basic(ChaiScript_Basic *this)

{
  ~ChaiScript_Basic(this);
  operator_delete(this,800);
  return;
}

Assistant:

virtual ~ChaiScript_Basic() = default;